

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O3

void Extra_FileReaderFree(Extra_FileReader_t *p)

{
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  Vec_Int_t *__ptr_01;
  int *__ptr_02;
  
  if ((FILE *)p->pFile != (FILE *)0x0) {
    fclose((FILE *)p->pFile);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  __ptr = p->vTokens;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  __ptr_01 = p->vLines;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (int *)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  free(p);
  return;
}

Assistant:

void Extra_FileReaderFree( Extra_FileReader_t * p )
{
    if ( p->pFile )
        fclose( p->pFile );
    ABC_FREE( p->pBuffer );
    Vec_PtrFree( p->vTokens );
    Vec_IntFree( p->vLines );
    ABC_FREE( p );
}